

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_server2.c
# Opt level: O0

int unhexify(uchar *output,char *input,size_t *olen)

{
  byte bVar1;
  size_t sVar2;
  ulong local_38;
  size_t j;
  uchar c;
  size_t *olen_local;
  char *input_local;
  uchar *output_local;
  
  sVar2 = strlen(input);
  *olen = sVar2;
  if (((*olen & 1) == 0) && (*olen >> 1 < 0x21)) {
    *olen = *olen >> 1;
    for (local_38 = 0; local_38 < *olen << 1; local_38 = local_38 + 2) {
      bVar1 = input[local_38];
      if ((bVar1 < 0x30) || (0x39 < bVar1)) {
        if ((bVar1 < 0x61) || (0x66 < bVar1)) {
          if ((bVar1 < 0x41) || (0x46 < bVar1)) {
            return -1;
          }
          j._7_1_ = bVar1 - 0x37;
        }
        else {
          j._7_1_ = bVar1 + 0xa9;
        }
      }
      else {
        j._7_1_ = bVar1 - 0x30;
      }
      output[local_38 >> 1] = j._7_1_ << 4;
      bVar1 = input[local_38 + 1];
      if ((bVar1 < 0x30) || (0x39 < bVar1)) {
        if ((bVar1 < 0x61) || (0x66 < bVar1)) {
          if ((bVar1 < 0x41) || (0x46 < bVar1)) {
            return -1;
          }
          j._7_1_ = bVar1 - 0x37;
        }
        else {
          j._7_1_ = bVar1 + 0xa9;
        }
      }
      else {
        j._7_1_ = bVar1 - 0x30;
      }
      output[local_38 >> 1] = output[local_38 >> 1] | j._7_1_;
    }
    output_local._4_4_ = 0;
  }
  else {
    output_local._4_4_ = -1;
  }
  return output_local._4_4_;
}

Assistant:

int unhexify( unsigned char *output, const char *input, size_t *olen )
{
    unsigned char c;
    size_t j;

    *olen = strlen( input );
    if( *olen % 2 != 0 || *olen / 2 > MBEDTLS_PSK_MAX_LEN )
        return( -1 );
    *olen /= 2;

    for( j = 0; j < *olen * 2; j += 2 )
    {
        c = input[j];
        HEX2NUM( c );
        output[ j / 2 ] = c << 4;

        c = input[j + 1];
        HEX2NUM( c );
        output[ j / 2 ] |= c;
    }

    return( 0 );
}